

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitation_impl.hpp
# Opt level: O0

result_type
boost::detail::variant::
visitation_impl<mpl_::int_<0>,boost::detail::variant::visitation_impl_step<boost::mpl::l_iter<boost::mpl::l_item<mpl_::long_<2l>,spartsi::node,boost::mpl::l_item<mpl_::long_<1l>,spartsi::ref_node,boost::mpl::l_end>>>,boost::mpl::l_iter<boost::mpl::l_end>>,boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
          (undefined4 internal_which,undefined4 logical_which,void *visitor,int_<0> *storage,
          visitation_impl_step<boost::mpl::l_iter<boost::mpl::l_item<mpl_::long_<2L>,_spartsi::node,_boost::mpl::l_item<mpl_::long_<1L>,_spartsi::ref_node,_boost::mpl::l_end>_>_>,_boost::mpl::l_iter<boost::mpl::l_end>_>
          *param_5,undefined8 param_6)

{
  integral_constant local_4e [22];
  undefined8 local_38;
  visitation_impl_step<boost::mpl::l_iter<boost::mpl::l_item<mpl_::long_<2L>,_spartsi::node,_boost::mpl::l_item<mpl_::long_<1L>,_spartsi::ref_node,_boost::mpl::l_end>_>_>,_boost::mpl::l_iter<boost::mpl::l_end>_>
  *param_30_local;
  int_<0> *param_29_local;
  void *storage_local;
  destroyer *visitor_local;
  undefined4 local_10;
  int logical_which_local;
  int internal_which_local;
  
  local_38 = param_6;
  param_30_local = param_5;
  param_29_local = storage;
  storage_local = visitor;
  visitor_local._4_4_ = logical_which;
  local_10 = internal_which;
  switch(logical_which) {
  case 0:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,spartsi::node,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 1:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,spartsi::ref_node,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 2:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 3:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 4:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 5:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 6:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 7:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 8:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 9:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 10:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0xb:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0xc:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0xd:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0xe:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0xf:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0x10:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0x11:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0x12:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  case 0x13:
    visitation_impl_invoke<boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,visitor,storage,0,1);
    break;
  default:
    integral_constant::operator_cast_to_bool__(local_4e);
    visitation_impl<mpl_::int_<20>,boost::detail::variant::visitation_impl_step<boost::mpl::l_iter<boost::mpl::l_end>,boost::mpl::l_iter<boost::mpl::l_end>>,boost::detail::variant::destroyer,void*,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
              (internal_which,logical_which,visitor,storage,0);
  }
  return;
}

Assistant:

visitation_impl(
      const int internal_which, const int logical_which
    , Visitor& visitor, VoidPtrCV storage
    , mpl::false_ // is_apply_visitor_unrolled
    , NoBackupFlag no_backup_flag
    , Which* = 0, step0* = 0
    )
{
    // Typedef apply_visitor_unrolled steps and associated types...
#   define BOOST_VARIANT_AUX_APPLY_VISITOR_STEP_TYPEDEF(z, N, _) \
    typedef typename BOOST_PP_CAT(step,N)::type BOOST_PP_CAT(T,N); \
    typedef typename BOOST_PP_CAT(step,N)::next \
        BOOST_PP_CAT(step, BOOST_PP_INC(N)); \
    /**/

    BOOST_PP_REPEAT(
          BOOST_VARIANT_VISITATION_UNROLLING_LIMIT
        , BOOST_VARIANT_AUX_APPLY_VISITOR_STEP_TYPEDEF
        , _
        )

#   undef BOOST_VARIANT_AUX_APPLY_VISITOR_STEP_TYPEDEF

    // ...switch on the target which-index value...
    switch (logical_which)
    {

    // ...applying the appropriate case:
#   define BOOST_VARIANT_AUX_APPLY_VISITOR_STEP_CASE(z, N, _) \
    case (Which::value + (N)): \
        return (visitation_impl_invoke)( \
              internal_which, visitor, storage \
            , static_cast<BOOST_PP_CAT(T,N)*>(0) \
            , no_backup_flag, 1L \
            ); \
    /**/

    BOOST_PP_REPEAT(
          BOOST_VARIANT_VISITATION_UNROLLING_LIMIT
        , BOOST_VARIANT_AUX_APPLY_VISITOR_STEP_CASE
        , _
        )

#   undef BOOST_VARIANT_AUX_APPLY_VISITOR_STEP_CASE

    default: break;
    }

    // If not handled in this iteration, continue unrolling:
    typedef mpl::int_<
          Which::value + (BOOST_VARIANT_VISITATION_UNROLLING_LIMIT)
        > next_which;

    typedef BOOST_PP_CAT(step, BOOST_VARIANT_VISITATION_UNROLLING_LIMIT)
        next_step;

    typedef typename next_step::type next_type;
    typedef typename is_same< next_type,apply_visitor_unrolled >::type
        is_apply_visitor_unrolled;

    return detail::variant::visitation_impl(
          internal_which, logical_which
        , visitor, storage
        , is_apply_visitor_unrolled()
        , no_backup_flag
        , static_cast<next_which*>(0), static_cast<next_step*>(0)
        );
}